

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O2

UnicodeString * __thiscall icu_63::EquivIterator::next(EquivIterator *this)

{
  UBool UVar1;
  UnicodeString *this_00;
  
  this_00 = (UnicodeString *)Hashtable::get(this->_hash,this->_current);
  if ((this_00 != (UnicodeString *)0x0) &&
     (UVar1 = UnicodeString::operator==(this_00,this->_start), UVar1 == '\0')) {
    this->_current = this_00;
    return this_00;
  }
  return (UnicodeString *)0x0;
}

Assistant:

const icu::UnicodeString *
EquivIterator::next() {
    const icu::UnicodeString* _next = (const icu::UnicodeString*) _hash.get(*_current);
    if (_next == NULL) {
        U_ASSERT(_current == _start);
        return NULL;
    }
    if (*_next == *_start) {
        return NULL;
    }
    _current = _next;
    return _next;
}